

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O0

void __thiscall TPZMHMeshControl::AddBoundaryInterfaceElements(TPZMHMeshControl *this)

{
  bool bVar1;
  int iVar2;
  TPZGeoMesh *this_00;
  TPZCompMesh *this_01;
  TPZCompMesh *mesh;
  TPZCompMesh *this_02;
  TPZAdmChunkVector<TPZCompEl_*,_10> *left;
  TPZCompElSide *right;
  TPZCompElSide *celside_00;
  undefined4 extraout_var;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar3;
  TPZGeoEl *gelnew;
  TPZGeoElSide gs;
  TPZCompElSide cs;
  int64_t i;
  int64_t nst;
  TPZCompElSide celside;
  TPZGeoElSide gelside;
  TPZStack<TPZCompElSide,_10> celstack;
  int matid;
  TPZGeoEl *gel;
  TPZCompEl *cel;
  int64_t el;
  int64_t nel;
  set<int,_std::less<int>,_std::allocator<int>_> notincluded;
  int dim;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffffd38;
  TPZCompMesh *in_stack_fffffffffffffd40;
  TPZGeoEl *in_stack_fffffffffffffd48;
  TPZCompMesh *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  uint in_stack_fffffffffffffd5c;
  TPZChunkVector<TPZCompEl_*,_10> *in_stack_fffffffffffffd60;
  TPZGeoElSide local_1d8;
  TPZCompElSide local_1c0;
  int64_t local_1b0;
  long local_1a8;
  TPZGeoElSide local_190;
  TPZVec<TPZCompElSide> local_178 [3];
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  TPZStack<TPZCompElSide,_10> *in_stack_fffffffffffffef8;
  TPZGeoElSide *in_stack_ffffffffffffff00;
  _Self local_b8;
  _Self local_b0;
  uint local_a4;
  TPZGeoEl *local_a0;
  TPZCompEl *local_98;
  long local_90;
  TPZCompMesh *local_88;
  _Base_ptr local_80;
  undefined1 local_78;
  _Base_ptr local_70;
  undefined1 local_68;
  _Base_ptr local_60;
  undefined1 local_58;
  int local_c;
  
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10));
  TPZCompMesh::LoadReferences(in_stack_fffffffffffffd50);
  this_00 = TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
  local_c = TPZGeoMesh::Dimension(this_00);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1e11905);
  pVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffd60,
                     (value_type_conflict4 *)
                     CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  local_60 = (_Base_ptr)pVar3.first._M_node;
  local_58 = pVar3.second;
  pVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffd60,
                     (value_type_conflict4 *)
                     CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  local_70 = (_Base_ptr)pVar3.first._M_node;
  local_68 = pVar3.second;
  pVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffd60,
                     (value_type_conflict4 *)
                     CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  local_80 = (_Base_ptr)pVar3.first._M_node;
  local_78 = pVar3.second;
  this_01 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10));
  mesh = (TPZCompMesh *)TPZCompMesh::NElements((TPZCompMesh *)0x1e11a05);
  local_88 = mesh;
  for (local_90 = 0; local_90 < (long)local_88; local_90 = local_90 + 1) {
    this_02 = TPZAutoPointer<TPZCompMesh>::operator->
                        ((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10));
    left = TPZCompMesh::ElementVec(this_02);
    right = (TPZCompElSide *)
            TPZChunkVector<TPZCompEl_*,_10>::operator[]
                      (in_stack_fffffffffffffd60,
                       CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    local_98 = right->fEl;
    if ((((local_98 != (TPZCompEl *)0x0) &&
         (local_a0 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffd48),
         local_a0 != (TPZGeoEl *)0x0)) &&
        (iVar2 = (**(code **)(*(long *)local_a0 + 0x210))(), iVar2 != local_c)) &&
       (iVar2 = (**(code **)(*(long *)local_a0 + 0x1d0))(), iVar2 == 0)) {
      local_a4 = TPZGeoEl::MaterialId(local_a0);
      local_b0._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::find
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffd48,
                      (key_type *)in_stack_fffffffffffffd40);
      local_b8._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_fffffffffffffd38);
      bVar1 = std::operator!=(&local_b0,&local_b8);
      if (!bVar1) {
        iVar2 = (**(code **)(*(long *)local_a0 + 0x210))();
        if (iVar2 != local_c + -1) {
          pzinternal::DebugStopImpl
                    ((char *)celstack.super_TPZManVector<TPZCompElSide,_10>.
                             super_TPZVec<TPZCompElSide>.fNElements,
                     (size_t)celstack.super_TPZManVector<TPZCompElSide,_10>.
                             super_TPZVec<TPZCompElSide>.fStore);
        }
        TPZStack<TPZCompElSide,_10>::TPZStack
                  ((TPZStack<TPZCompElSide,_10> *)in_stack_fffffffffffffd50);
        (**(code **)(*(long *)local_a0 + 0xf0))();
        TPZGeoElSide::TPZGeoElSide
                  ((TPZGeoElSide *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                   (int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
        TPZGeoElSide::Reference((TPZGeoElSide *)in_stack_fffffffffffffd48);
        TPZGeoElSide::EqualorHigherCompElementList2
                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                   in_stack_fffffffffffffef0);
        local_1a8 = TPZVec<TPZCompElSide>::size(local_178);
        for (local_1b0 = 0; local_1b0 < local_1a8; local_1b0 = local_1b0 + 1) {
          celside_00 = TPZVec<TPZCompElSide>::operator[](local_178,local_1b0);
          TPZCompElSide::TPZCompElSide(&local_1c0,celside_00);
          TPZCompElSide::Reference
                    ((TPZCompElSide *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58))
          ;
          iVar2 = TPZGeoElSide::operator==(&local_1d8,&local_190);
          if (iVar2 == 0) {
            in_stack_fffffffffffffd60 =
                 (TPZChunkVector<TPZCompEl_*,_10> *)TPZGeoElSide::Element(&local_1d8);
            in_stack_fffffffffffffd5c = TPZGeoElSide::Side(&local_1d8);
            iVar2 = (*(in_stack_fffffffffffffd60->super_TPZSavable)._vptr_TPZSavable[0x2e])
                              (in_stack_fffffffffffffd60,(ulong)in_stack_fffffffffffffd5c,
                               (ulong)local_a4);
            in_stack_fffffffffffffd50 = (TPZCompMesh *)CONCAT44(extraout_var,iVar2);
            in_stack_fffffffffffffd48 = (TPZGeoEl *)operator_new(0x80);
            in_stack_fffffffffffffd40 =
                 ::TPZAutoPointer::operator_cast_to_TPZCompMesh_((TPZAutoPointer *)(in_RDI + 0x10));
            TPZInterfaceElement::TPZInterfaceElement
                      ((TPZInterfaceElement *)this_01,mesh,(TPZGeoEl *)this_02,(TPZCompElSide *)left
                       ,right);
          }
          TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e11e47);
        }
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e11eb0);
        TPZStack<TPZCompElSide,_10>::~TPZStack((TPZStack<TPZCompElSide,_10> *)0x1e11ebd);
      }
    }
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1e11eff);
  return;
}

Assistant:

void TPZMHMeshControl::AddBoundaryInterfaceElements()
{
    fCMesh->LoadReferences();
    int dim = fGMesh->Dimension();
    std::set<int> notincluded;
    notincluded.insert(fSkeletonMatId);
    notincluded.insert(fLagrangeMatIdLeft);
    notincluded.insert(fLagrangeMatIdRight);
    int64_t nel = fCMesh->NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZCompEl *cel = fCMesh->ElementVec()[el];
        if (!cel) {
            continue;
        }
        TPZGeoEl *gel = cel->Reference();
        if (!gel || gel->Dimension() == dim || gel->HasSubElement()) {
            continue;
        }
        int matid = gel->MaterialId();
        if (notincluded.find(matid) != notincluded.end()) {
            continue;
        }
        if (gel->Dimension() != dim-1) {
            DebugStop();
        }
        TPZStack<TPZCompElSide> celstack;
        TPZGeoElSide gelside(gel,gel->NSides()-1);
        TPZCompElSide celside = gelside.Reference();
        gelside.EqualorHigherCompElementList2(celstack, 1, 0);
        int64_t nst = celstack.size();
        for (int64_t i=0; i<nst; i++) {
            TPZCompElSide cs = celstack[i];
            TPZGeoElSide gs = cs.Reference();
            if (gs == gelside) {
                continue;
            }
            TPZGeoEl *gelnew = gs.Element()->CreateBCGeoEl(gs.Side(), matid);
            new TPZInterfaceElement(fCMesh, gelnew, cs, celside);

        }
    }
}